

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noproxy.c
# Opt level: O2

_Bool Curl_check_noproxy(char *name,char *no_proxy)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  char *pcVar5;
  ulong __n;
  uint *puVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong __n_00;
  char *__src;
  uint uVar10;
  uint *first;
  char cVar11;
  bool bVar12;
  uint local_168 [4];
  uchar address_1 [16];
  uint address;
  char hostip [128];
  
  if (no_proxy == (char *)0x0) {
    return false;
  }
  bVar2 = *no_proxy;
  if (bVar2 == 0) {
    return false;
  }
  if (bVar2 == 0x2a) {
    iVar7 = -(uint)(byte)no_proxy[1];
  }
  else {
    iVar7 = 0x2a - (uint)bVar2;
  }
  if (iVar7 == 0) {
    return true;
  }
  if (*name == '[') {
    pcVar5 = strchr(name,0x5d);
    if (pcVar5 == (char *)0x0) {
      return false;
    }
    __src = name + 1;
    __n = (long)pcVar5 - (long)__src;
    if (0x7f < __n) {
      return false;
    }
    cVar11 = '\x02';
    name = hostip;
    memcpy(name,__src,__n);
    hostip[__n] = '\0';
  }
  else {
    iVar7 = inet_pton(2,name,&address);
    cVar11 = iVar7 == 1;
    __n = strlen(name);
    bVar2 = *no_proxy;
  }
  do {
    if (bVar2 == 0) {
      return false;
    }
    lVar9 = (long)&address - (long)no_proxy;
    puVar6 = (uint *)((long)no_proxy + -1);
    first = (uint *)no_proxy;
    while ((bVar2 == 9 || (bVar2 == 0x20))) {
      pbVar1 = (byte *)((long)first + 1);
      first = (uint *)((long)first + 1);
      lVar9 = lVar9 + -1;
      puVar6 = (uint *)((long)puVar6 + 1);
      bVar2 = *pbVar1;
    }
    __n_00 = 0;
    no_proxy = (char *)puVar6;
    bVar3 = bVar2;
    while ((0x2c < bVar3 || ((0x100100000201U >> ((ulong)bVar3 & 0x3f) & 1) == 0))) {
      bVar3 = *(byte *)((long)first + __n_00 + 1);
      __n_00 = __n_00 + 1;
      no_proxy = (char *)((long)no_proxy + 1);
    }
    if (__n_00 != 0) {
      if (cVar11 == '\0') {
        if (bVar2 == 0x2e) {
          if (__n_00 - 1 <= __n) {
            first = (uint *)((long)first + 1);
            pcVar5 = name + ((__n + 1) - __n_00);
LAB_0013b7a0:
            iVar7 = Curl_strncasecompare((char *)first,pcVar5,__n);
            if (iVar7 != 0) {
              return true;
            }
          }
        }
        else {
          pcVar5 = name;
          if (__n == __n_00) goto LAB_0013b7a0;
        }
      }
      else {
        pcVar5 = strchr((char *)first,0x2f);
        if (pcVar5 < (char *)((long)first + __n_00) && pcVar5 != (char *)0x0) {
          if (__n_00 < 0x80) {
            uVar4 = atoi(pcVar5 + 1);
            memcpy(&address,first,__n_00);
            pcVar5[lVar9] = '\0';
            if (cVar11 == '\x02') {
              if (uVar4 == 0) {
                uVar4 = 0x80;
              }
              first = &address;
              goto LAB_0013b6e6;
            }
            address_1[0] = '\0';
            address_1[1] = '\0';
            address_1[2] = '\0';
            address_1[3] = '\0';
            local_168[0] = 0;
            first = &address;
            if (uVar4 < 0x21) goto LAB_0013b7cb;
          }
        }
        else if (cVar11 == '\x02') {
          uVar4 = 0x80;
LAB_0013b6e6:
          iVar7 = inet_pton(10,name,address_1);
          if (((iVar7 == 1) && (iVar7 = inet_pton(10,(char *)first,local_168), uVar4 < 0x88)) &&
             (iVar7 == 1)) {
            uVar10 = uVar4 >> 3;
            uVar8 = uVar4 & 7;
            if ((uVar10 != 0x10 || uVar8 == 0) &&
               ((uVar4 < 8 || (iVar7 = bcmp(address_1,local_168,(ulong)uVar10), iVar7 == 0)))) {
              if (uVar8 == 0) {
                return true;
              }
              if ((byte)((*(byte *)((long)local_168 + (ulong)uVar10) ^ address_1[uVar10]) >>
                        (8U - (char)uVar8 & 0x1f)) != 0) {
                return true;
              }
            }
          }
        }
        else {
          uVar4 = 0;
LAB_0013b7cb:
          address_1[0] = '\0';
          address_1[1] = '\0';
          address_1[2] = '\0';
          address_1[3] = '\0';
          local_168[0] = 0;
          iVar7 = inet_pton(2,name,address_1);
          if ((iVar7 == 1) && (iVar7 = inet_pton(2,(char *)first,local_168), iVar7 == 1)) {
            if ((uVar4 & 0x1f) == 0) {
              bVar12 = address_1._0_4_ == local_168[0];
            }
            else {
              uVar8 = local_168[0] ^ address_1._0_4_;
              bVar12 = (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                       uVar8 << 0x18) >> (-(char)uVar4 & 0x1fU) == 0;
            }
            if (bVar12) {
              return true;
            }
          }
        }
      }
    }
    do {
      bVar2 = *(byte *)((long)no_proxy + 1);
      no_proxy = (char *)((long)no_proxy + 1);
    } while (bVar2 == 0x2c);
  } while( true );
}

Assistant:

bool Curl_check_noproxy(const char *name, const char *no_proxy)
{
  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  if(no_proxy && no_proxy[0]) {
    const char *p = no_proxy;
    size_t namelen;
    enum nametype type = TYPE_HOST;
    char hostip[128];
    if(!strcmp("*", no_proxy))
      return TRUE;

    /* NO_PROXY was specified and it wasn't just an asterisk */

    if(name[0] == '[') {
      char *endptr;
      /* IPv6 numerical address */
      endptr = strchr(name, ']');
      if(!endptr)
        return FALSE;
      name++;
      namelen = endptr - name;
      if(namelen >= sizeof(hostip))
        return FALSE;
      memcpy(hostip, name, namelen);
      hostip[namelen] = 0;
      name = hostip;
      type = TYPE_IPV6;
    }
    else {
      unsigned int address;
      if(1 == Curl_inet_pton(AF_INET, name, &address))
        type = TYPE_IPV4;
      namelen = strlen(name);
    }

    while(*p) {
      const char *token;
      size_t tokenlen = 0;
      bool match = FALSE;

      /* pass blanks */
      while(*p && ISBLANK(*p))
        p++;

      token = p;
      /* pass over the pattern */
      while(*p && !ISBLANK(*p) && (*p != ',')) {
        p++;
        tokenlen++;
      }

      if(tokenlen) {
        switch(type) {
        case TYPE_HOST:
          if(*token == '.') {
            ++token;
            --tokenlen;
            /* tailmatch */
            match = (tokenlen <= namelen) &&
              strncasecompare(token, name + (namelen - tokenlen), namelen);
          }
          else
            match = (tokenlen == namelen) &&
              strncasecompare(token, name, namelen);
          break;
        case TYPE_IPV4:
          /* FALLTHROUGH */
        case TYPE_IPV6: {
          const char *check = token;
          char *slash = strchr(check, '/');
          unsigned int bits = 0;
          char checkip[128];
          /* if the slash is part of this token, use it */
          if(slash && (slash < &check[tokenlen])) {
            bits = atoi(slash + 1);
            /* copy the check name to a temp buffer */
            if(tokenlen >= sizeof(checkip))
              break;
            memcpy(checkip, check, tokenlen);
            checkip[ slash - check ] = 0;
            check = checkip;
          }
          if(type == TYPE_IPV6)
            match = Curl_cidr6_match(name, check, bits);
          else
            match = Curl_cidr4_match(name, check, bits);
          break;
        }
        }
        if(match)
          return TRUE;
      } /* if(tokenlen) */
      while(*p == ',')
        p++;
    } /* while(*p) */
  } /* NO_PROXY was specified and it wasn't just an asterisk */

  return FALSE;
}